

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.h
# Opt level: O0

Var __thiscall
Js::DataView::GetValue<unsigned_char>
          (DataView *this,Var offset,char16 *funcName,BOOL isLittleEndian)

{
  bool bVar1;
  uint nValue;
  ArrayBufferBase *this_00;
  uchar **ppuVar2;
  uchar *typedBuffer;
  uint32 local_50;
  uint32 uStack_4c;
  uchar item;
  uint32 byteOffset;
  uint32 length;
  ScriptContext *scriptContext;
  char16 *pcStack_38;
  BOOL isLittleEndian_local;
  char16 *funcName_local;
  Var offset_local;
  DataView *this_local;
  uint local_14;
  Var local_10;
  
  scriptContext._4_4_ = isLittleEndian;
  pcStack_38 = funcName;
  funcName_local = (char16 *)offset;
  offset_local = this;
  _byteOffset = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  uStack_4c = ArrayObject::GetLength((ArrayObject *)this);
  if (uStack_4c == 0) {
    JavascriptError::ThrowRangeError(_byteOffset,-0x7ff5ec1f,pcStack_38);
  }
  local_50 = ArrayBuffer::ToIndex(funcName_local,-0x7ff5ec1f,_byteOffset,uStack_4c - 1,false);
  this_00 = ArrayBufferParent::GetArrayBuffer(&this->super_ArrayBufferParent);
  bVar1 = ArrayBufferBase::IsDetached(this_00);
  if (!bVar1) {
    ppuVar2 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                        ((WriteBarrierPtr *)&this->buffer);
    if (scriptContext._4_4_ == 0) {
      SwapRoutine<unsigned_char>(this,*ppuVar2 + local_50,(uint8 *)((long)&typedBuffer + 7));
    }
    else {
      typedBuffer._7_1_ = (*ppuVar2)[local_50];
    }
    nValue = (uint)typedBuffer._7_1_;
    this_local = (DataView *)RecyclableObject::GetScriptContext((RecyclableObject *)this);
    local_14 = nValue;
    bVar1 = TaggedInt::IsOverflow(nValue);
    if (bVar1) {
      local_10 = JavascriptNumber::NewInlined((double)(int)local_14,(ScriptContext *)this_local);
    }
    else {
      local_10 = TaggedInt::ToVarUnchecked(local_14);
    }
    return local_10;
  }
  JavascriptError::ThrowTypeError(_byteOffset,-0x7ff5ebe5,pcStack_38);
}

Assistant:

Var GetValue(Var offset, const char16* funcName, BOOL isLittleEndian = FALSE)
        {
            ScriptContext* scriptContext = GetScriptContext();

            uint32 length = GetLength();
            if (length < sizeof(TypeName))
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_DataView_InvalidOffset, funcName);
            }

            uint32 byteOffset = ArrayBuffer::ToIndex(offset, JSERR_DataView_InvalidOffset, scriptContext, length - sizeof(TypeName), false);
            if (this->GetArrayBuffer()->IsDetached())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, funcName);
            }

            TypeName item;
            TypeName* typedBuffer = (TypeName*)(buffer + byteOffset);
            if (!isLittleEndian)
            {
                SwapRoutine<TypeName>(typedBuffer, &item);
            }
            else
            {
                item = *typedBuffer;
            }
            return JavascriptNumber::ToVar(item, GetScriptContext());
        }